

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_user_exception_ls(sexp ctx,sexp self,char *msg,int n,...)

{
  char in_AL;
  sexp psVar1;
  sexp psVar2;
  ulong uVar3;
  sexp psVar4;
  sexp_gc_var_t *extraout_RDX;
  sexp_gc_var_t *n_00;
  sexp in_R8;
  sexp in_R9;
  sexp in_XMM0_Qa;
  sexp in_XMM1_Qa;
  sexp in_XMM2_Qa;
  sexp in_XMM3_Qa;
  sexp_heap_conflict in_XMM4_Qa;
  sexp_mark_stack_ptr_t *in_XMM5_Qa;
  sexp_conflict *in_XMM6_Qa;
  sexp_mark_stack_ptr_t *in_XMM7_Qa;
  sexp ir;
  sexp res;
  va_list ap;
  sexp local_128;
  undefined1 local_120 [40];
  undefined1 local_f8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  psVar1 = (sexp)&local_128;
  local_f8._16_8_ = &local_128;
  local_120._24_8_ = &stack0xffffffffffffff28;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f8._0_8_ = local_120;
  local_120._0_8_ = 5.36555291383594e-321;
  local_f8._24_8_ = local_120 + 0x28;
  local_f8._8_8_ = (ctx->value).context.saves;
  n_00 = (sexp_gc_var_t *)(local_f8 + 0x10);
  (ctx->value).context.saves = n_00;
  local_120._16_8_ = &res;
  local_120._8_8_ = (sexp)0x3000000020;
  local_128 = (sexp)&DAT_0000023e;
  psVar4 = (sexp)&local_128;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (0 < n) {
    do {
      uVar3 = local_120._8_8_ & 0xffffffff;
      if (uVar3 < 0x29) {
        psVar4 = (sexp)(ulong)(local_120._8_4_ + 8);
        local_120._8_4_ = local_120._8_4_ + 8;
        psVar2 = (sexp)((long)(sexp_tag_t *)local_120._24_8_ + uVar3);
      }
      else {
        psVar4 = (sexp)(local_120._16_8_ + 8);
        psVar2 = (sexp)local_120._16_8_;
        local_120._16_8_ = psVar4;
      }
      local_128 = sexp_cons_op(ctx,psVar1,(sexp_sint_t)psVar4,*(sexp *)psVar2,local_128);
      n = n + -1;
      n_00 = extraout_RDX;
      psVar4 = (sexp)local_f8._16_8_;
    } while (n != 0);
  }
  local_f8._16_8_ = psVar4;
  local_128 = sexp_nreverse_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,local_128);
  psVar1 = sexp_user_exception(ctx,self,msg,local_128);
  (ctx->value).context.saves = (sexp_gc_var_t *)local_f8._8_8_;
  return psVar1;
}

Assistant:

sexp sexp_user_exception_ls (sexp ctx, sexp self, const char *msg, int n, ...) {
  int i;
  va_list ap;
  sexp_gc_var2(res, ir);
  sexp_gc_preserve2(ctx, res, ir);
  va_start(ap, n);
  for (i=0, ir=SEXP_NULL; i < n; ++i) {
    ir = sexp_cons(ctx, va_arg(ap, sexp), ir);
  }
  ir = sexp_nreverse(ctx, ir);
  res = sexp_user_exception(ctx, self, msg, ir);
  sexp_gc_release2(ctx);
  va_end(ap);
  return res;
}